

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O2

void __thiscall Lowerer::GenerateFastArrayIsIn(Lowerer *this,Instr *instr)

{
  bool bVar1;
  LabelInstr *labelFail;
  LabelInstr *target;
  LabelInstr *target_00;
  RegOpnd *pRVar2;
  RegOpnd *pRVar3;
  Opnd *pOVar4;
  Lowerer *this_00;
  IndirOpnd *pIVar5;
  IntConstOpnd *pIVar6;
  Opnd *pOVar7;
  Lowerer *pLVar8;
  undefined1 local_98 [8];
  AutoReuseOpnd autoReuseArrayOpnd;
  AutoReuseOpnd autoReuseHeadSegmentOpnd;
  AutoReuseOpnd autoReuseHeadSegmentLengthOpnd;
  
  pOVar4 = instr->m_src1;
  pOVar7 = instr->m_src2;
  local_98._0_2_ = (pOVar4->m_valueType).field_0.bits;
  bVar1 = ValueType::IsLikelyInt((ValueType *)local_98);
  if (bVar1) {
    bVar1 = IR::Opnd::IsNotInt(pOVar4);
    if (!bVar1) {
      autoReuseArrayOpnd._16_2_ = (pOVar7->m_valueType).field_0.bits;
      bVar1 = ValueType::IsLikelyArray((ValueType *)&autoReuseArrayOpnd.autoDelete);
      if (bVar1) {
        autoReuseHeadSegmentOpnd._16_2_ = (pOVar7->m_valueType).field_0.bits;
        bVar1 = ValueType::HasNoMissingValues((ValueType *)&autoReuseHeadSegmentOpnd.autoDelete);
        if (bVar1) {
          labelFail = IR::LabelInstr::New(Label,this->m_func,true);
          target = IR::LabelInstr::New(Label,this->m_func,false);
          target_00 = IR::LabelInstr::New(Label,this->m_func,false);
          pRVar2 = IR::Opnd::AsRegOpnd(pOVar4);
          pRVar2 = GenerateUntagVar(this,pRVar2,labelFail,instr,true);
          pRVar3 = IR::RegOpnd::New(TyUint64,this->m_func);
          InsertMove(&pRVar3->super_Opnd,pOVar7,instr,true);
          local_98 = (undefined1  [8])0x0;
          autoReuseArrayOpnd.func._1_1_ = 1;
          LowererMD::GenerateObjectTest
                    (&this->m_lowererMD,&pRVar3->super_Opnd,instr,labelFail,false);
          pOVar4 = IR::Opnd::Copy(&pRVar3->super_Opnd,instr->m_func);
          this_00 = (Lowerer *)IR::Opnd::AsRegOpnd(pOVar4);
          IR::AutoReuseOpnd::Initialize
                    ((AutoReuseOpnd *)local_98,(Opnd *)this_00,instr->m_func,false);
          pOVar4 = LoadVTableValueOpnd(this,instr,VtableJavascriptArray);
          pLVar8 = this_00;
          pIVar5 = IR::IndirOpnd::New((RegOpnd *)this_00,0,TyUint64,instr->m_func,false);
          InsertCompareBranch(pLVar8,&pIVar5->super_Opnd,pOVar4,BrEq_A,target_00,instr,false);
          pOVar4 = LoadVTableValueOpnd(this,instr,VtableNativeIntArray);
          pLVar8 = this_00;
          pIVar5 = IR::IndirOpnd::New((RegOpnd *)this_00,0,TyUint64,instr->m_func,false);
          InsertCompareBranch(pLVar8,&pIVar5->super_Opnd,pOVar4,BrEq_A,target_00,instr,false);
          pOVar4 = LoadVTableValueOpnd(this,instr,VtableNativeFloatArray);
          pIVar5 = IR::IndirOpnd::New((RegOpnd *)this_00,0,TyUint64,instr->m_func,false);
          InsertCompareBranch(this_00,&pIVar5->super_Opnd,pOVar4,BrNeq_A,labelFail,instr,false);
          IR::Instr::InsertBefore(instr,&target_00->super_Instr);
          pIVar5 = IR::IndirOpnd::New(pRVar3,0x18,TyUint8,this->m_func,false);
          pIVar6 = IR::IntConstOpnd::New(4,TyUint8,this->m_func,true);
          InsertTestBranch(&pIVar5->super_Opnd,&pIVar6->super_Opnd,BrEq_A,labelFail,instr);
          autoReuseArrayOpnd.autoDelete = false;
          autoReuseArrayOpnd.wasInUse = false;
          autoReuseArrayOpnd._18_6_ = 0;
          autoReuseHeadSegmentOpnd.autoDelete = false;
          autoReuseHeadSegmentOpnd.wasInUse = false;
          autoReuseHeadSegmentOpnd._18_6_ = 0;
          autoReuseHeadSegmentOpnd.func._1_1_ = 1;
          pIVar5 = IR::IndirOpnd::New(pRVar3,0x28,TyUint64,this->m_func,false);
          pRVar3 = IR::RegOpnd::New(TyUint64,this->m_func);
          IR::AutoReuseOpnd::Initialize
                    ((AutoReuseOpnd *)&autoReuseArrayOpnd.autoDelete,&pRVar3->super_Opnd,
                     this->m_func,true);
          InsertMove(&pRVar3->super_Opnd,&pIVar5->super_Opnd,instr,true);
          pIVar5 = IR::IndirOpnd::New(pRVar3,4,TyUint32,this->m_func,false);
          pLVar8 = (Lowerer *)&autoReuseHeadSegmentOpnd.autoDelete;
          IR::AutoReuseOpnd::Initialize
                    ((AutoReuseOpnd *)pLVar8,&pIVar5->super_Opnd,this->m_func,true);
          InsertCompareBranch(pLVar8,&pRVar2->super_Opnd,&pIVar5->super_Opnd,BrGe_A,labelFail,instr,
                              false);
          pLVar8 = (Lowerer *)0x0;
          pIVar6 = IR::IntConstOpnd::New(0,(pRVar2->super_Opnd).m_type,this->m_func,false);
          InsertCompareBranch(pLVar8,&pRVar2->super_Opnd,&pIVar6->super_Opnd,BrLt_A,labelFail,instr,
                              false);
          pOVar4 = instr->m_dst;
          pOVar7 = LoadLibraryValueOpnd(this,instr,ValueTrue);
          InsertMove(pOVar4,pOVar7,instr,true);
          InsertBranch(Br,target,instr);
          IR::Instr::InsertBefore(instr,&labelFail->super_Instr);
          IR::Instr::InsertAfter(instr,&target->super_Instr);
          IR::AutoReuseOpnd::~AutoReuseOpnd((AutoReuseOpnd *)&autoReuseHeadSegmentOpnd.autoDelete);
          IR::AutoReuseOpnd::~AutoReuseOpnd((AutoReuseOpnd *)&autoReuseArrayOpnd.autoDelete);
          IR::AutoReuseOpnd::~AutoReuseOpnd((AutoReuseOpnd *)local_98);
        }
      }
    }
  }
  return;
}

Assistant:

void Lowerer::GenerateFastArrayIsIn(IR::Instr * instr)
{
    // operator "foo in bar"
    IR::Opnd* src1 = instr->GetSrc1(); // foo
    IR::Opnd* src2 = instr->GetSrc2(); // bar

    if (
        !src1->GetValueType().IsLikelyInt() ||
        // Do not do a fast path if we know for sure we don't have an int
        src1->IsNotInt() ||
        !src2->GetValueType().IsLikelyArray() ||
        !src2->GetValueType().HasNoMissingValues())
    {
        return;
    }

    IR::LabelInstr* helperLabel = IR::LabelInstr::New(Js::OpCode::Label, m_func, true);
    IR::LabelInstr* doneLabel = IR::LabelInstr::New(Js::OpCode::Label, m_func);
    IR::LabelInstr* isArrayLabel = IR::LabelInstr::New(Js::OpCode::Label, m_func);

    IR::RegOpnd* src1Untagged = GenerateUntagVar(src1->AsRegOpnd(), helperLabel, instr);
    IR::RegOpnd* src2RegOpnd = IR::RegOpnd::New(TyMachPtr, m_func);
    InsertMove(src2RegOpnd, src2, instr);


    IR::AutoReuseOpnd autoReuseArrayOpnd;
    m_lowererMD.GenerateObjectTest(src2RegOpnd, instr, helperLabel);
    IR::RegOpnd* arrayOpnd = src2RegOpnd->Copy(instr->m_func)->AsRegOpnd();
    autoReuseArrayOpnd.Initialize(arrayOpnd, instr->m_func, false /* autoDelete */);

    IR::Opnd* vtableOpnd = LoadVTableValueOpnd(instr, VTableValue::VtableJavascriptArray);
    InsertCompareBranch(
        IR::IndirOpnd::New(arrayOpnd, 0, TyMachPtr, instr->m_func),
        vtableOpnd,
        Js::OpCode::BrEq_A,
        isArrayLabel,
        instr);

    vtableOpnd = LoadVTableValueOpnd(instr, VTableValue::VtableNativeIntArray);
    InsertCompareBranch(
        IR::IndirOpnd::New(arrayOpnd, 0, TyMachPtr, instr->m_func),
        vtableOpnd,
        Js::OpCode::BrEq_A,
        isArrayLabel,
        instr);

    vtableOpnd = LoadVTableValueOpnd(instr, VTableValue::VtableNativeFloatArray);
    InsertCompareBranch(
        IR::IndirOpnd::New(arrayOpnd, 0, TyMachPtr, instr->m_func),
        vtableOpnd,
        Js::OpCode::BrNeq_A,
        helperLabel,
        instr);

    instr->InsertBefore(isArrayLabel);

    InsertTestBranch(
        IR::IndirOpnd::New(src2RegOpnd, Js::JavascriptArray::GetOffsetOfArrayFlags(), TyUint8, m_func),
        IR::IntConstOpnd::New(static_cast<uint8>(Js::DynamicObjectFlags::HasNoMissingValues), TyUint8, m_func, true),
        Js::OpCode::BrEq_A,
        helperLabel,
        instr);

    IR::AutoReuseOpnd autoReuseHeadSegmentOpnd;
    IR::AutoReuseOpnd autoReuseHeadSegmentLengthOpnd;
    IR::IndirOpnd* indirOpnd = IR::IndirOpnd::New(src2RegOpnd, Js::JavascriptArray::GetOffsetOfHead(), TyMachPtr, this->m_func);
    IR::RegOpnd* headSegmentOpnd = IR::RegOpnd::New(TyMachPtr, this->m_func);
    autoReuseHeadSegmentOpnd.Initialize(headSegmentOpnd, m_func);
    InsertMove(headSegmentOpnd, indirOpnd, instr);

    IR::Opnd* headSegmentLengthOpnd = IR::IndirOpnd::New(headSegmentOpnd, Js::SparseArraySegmentBase::GetOffsetOfLength(), TyUint32, m_func);
    autoReuseHeadSegmentLengthOpnd.Initialize(headSegmentLengthOpnd, m_func);

    InsertCompareBranch(
        src1Untagged,
        headSegmentLengthOpnd,
        Js::OpCode::BrGe_A,
        helperLabel,
        instr);
    InsertCompareBranch(
        src1Untagged,
        IR::IntConstOpnd::New(0, src1Untagged->GetType(), this->m_func),
        Js::OpCode::BrLt_A,
        helperLabel,
        instr);

    InsertMove(instr->GetDst(), LoadLibraryValueOpnd(instr, LibraryValue::ValueTrue), instr);
    InsertBranch(Js::OpCode::Br, doneLabel, instr);

    instr->InsertBefore(helperLabel);

    instr->InsertAfter(doneLabel);
}